

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

Vec_Int_t * Lpk_MergeBoundSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nSizeMax)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  int local_3c;
  int local_38;
  int k;
  int i;
  int Entry;
  int Entry1;
  int Entry0;
  Vec_Int_t *vSets;
  int nSizeMax_local;
  Vec_Int_t *vSets1_local;
  Vec_Int_t *vSets0_local;
  
  p = Vec_IntAlloc(100);
  for (local_38 = 0; iVar1 = Vec_IntSize(vSets0), local_38 < iVar1; local_38 = local_38 + 1) {
    uVar2 = Vec_IntEntry(vSets0,local_38);
    for (local_3c = 0; iVar1 = Vec_IntSize(vSets1), local_3c < iVar1; local_3c = local_3c + 1) {
      uVar3 = Vec_IntEntry(vSets1,local_3c);
      uVar3 = uVar2 | uVar3;
      if (((uVar3 & (int)uVar3 >> 0x10) == 0) &&
         (iVar1 = Kit_WordCountOnes(uVar3 & 0xffff), iVar1 <= nSizeMax)) {
        Vec_IntPush(p,uVar3);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Lpk_MergeBoundSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nSizeMax )
{
    Vec_Int_t * vSets;
    int Entry0, Entry1, Entry;
    int i, k;
    vSets = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        Entry = Entry0 | Entry1;
        if ( (Entry & (Entry >> 16)) )
            continue;
        if ( Kit_WordCountOnes(Entry & 0xffff) <= nSizeMax )
            Vec_IntPush( vSets, Entry );
    }
    return vSets;
}